

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# selu_x86_fma.cpp
# Opt level: O2

int __thiscall
ncnn::SELU_x86_fma::forward_inplace(SELU_x86_fma *this,Mat *bottom_top_blob,Option *opt)

{
  float fVar1;
  float fVar2;
  void *pvVar3;
  size_t sVar4;
  size_t sVar5;
  undefined1 auVar6 [32];
  ulong uVar7;
  long lVar8;
  undefined1 (*pauVar9) [32];
  int iVar10;
  int iVar11;
  ulong uVar12;
  long lVar13;
  float fVar14;
  undefined1 auVar15 [32];
  undefined1 auVar16 [64];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [32];
  undefined1 auVar38 [16];
  undefined1 auVar39 [32];
  undefined1 auVar40 [64];
  undefined1 auVar41 [16];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [64];
  undefined1 auVar46 [16];
  undefined1 auVar47 [64];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [64];
  undefined1 auVar53 [64];
  undefined1 extraout_var [60];
  
  iVar10 = bottom_top_blob->h * bottom_top_blob->w * bottom_top_blob->d * bottom_top_blob->elempack;
  uVar12 = 0;
  uVar7 = (ulong)(uint)bottom_top_blob->c;
  if (bottom_top_blob->c < 1) {
    uVar7 = uVar12;
  }
  auVar40 = ZEXT1664(ZEXT816(0) << 0x40);
  auVar45 = ZEXT3264(CONCAT428(0x3f000000,
                               CONCAT424(0x3f000000,
                                         CONCAT420(0x3f000000,
                                                   CONCAT416(0x3f000000,
                                                             CONCAT412(0x3f000000,
                                                                       CONCAT48(0x3f000000,
                                                                                0x3f0000003f000000))
                                                            )))));
  auVar47 = ZEXT3264(CONCAT428(0x3f800000,
                               CONCAT424(0x3f800000,
                                         CONCAT420(0x3f800000,
                                                   CONCAT416(0x3f800000,
                                                             CONCAT412(0x3f800000,
                                                                       CONCAT48(0x3f800000,
                                                                                0x3f8000003f800000))
                                                            )))));
  auVar52 = ZEXT3264(CONCAT428(0x395e8083,
                               CONCAT424(0x395e8083,
                                         CONCAT420(0x395e8083,
                                                   CONCAT416(0x395e8083,
                                                             CONCAT412(0x395e8083,
                                                                       CONCAT48(0x395e8083,
                                                                                0x395e8083395e8083))
                                                            )))));
  auVar53 = ZEXT3264(CONCAT428(0x3ab743ce,
                               CONCAT424(0x3ab743ce,
                                         CONCAT420(0x3ab743ce,
                                                   CONCAT416(0x3ab743ce,
                                                             CONCAT412(0x3ab743ce,
                                                                       CONCAT48(0x3ab743ce,
                                                                                0x3ab743ce3ab743ce))
                                                            )))));
  for (; uVar12 != uVar7; uVar12 = uVar12 + 1) {
    pvVar3 = bottom_top_blob->data;
    sVar4 = bottom_top_blob->elemsize;
    sVar5 = bottom_top_blob->cstep;
    pauVar9 = (undefined1 (*) [32])(sVar5 * uVar12 * sVar4 + (long)pvVar3);
    fVar1 = (this->super_SELU).alpha;
    auVar15._4_4_ = fVar1;
    auVar15._0_4_ = fVar1;
    auVar15._8_4_ = fVar1;
    auVar15._12_4_ = fVar1;
    auVar15._16_4_ = fVar1;
    auVar15._20_4_ = fVar1;
    auVar15._24_4_ = fVar1;
    auVar15._28_4_ = fVar1;
    fVar1 = (this->super_SELU).lambda;
    lVar13 = 0;
    for (iVar11 = 0; iVar11 + 7 < iVar10; iVar11 = iVar11 + 8) {
      auVar22 = vminps_avx(*pauVar9,auVar40._0_32_);
      auVar28._8_4_ = 0x42b0c0a5;
      auVar28._0_8_ = 0x42b0c0a542b0c0a5;
      auVar28._12_4_ = 0x42b0c0a5;
      auVar28._16_4_ = 0x42b0c0a5;
      auVar28._20_4_ = 0x42b0c0a5;
      auVar28._24_4_ = 0x42b0c0a5;
      auVar28._28_4_ = 0x42b0c0a5;
      auVar22 = vminps_avx(auVar22,auVar28);
      auVar29._8_4_ = 0xc2b0c0a5;
      auVar29._0_8_ = 0xc2b0c0a5c2b0c0a5;
      auVar29._12_4_ = 0xc2b0c0a5;
      auVar29._16_4_ = 0xc2b0c0a5;
      auVar29._20_4_ = 0xc2b0c0a5;
      auVar29._24_4_ = 0xc2b0c0a5;
      auVar29._28_4_ = 0xc2b0c0a5;
      auVar6 = vmaxps_avx(auVar22,auVar29);
      auVar30._8_4_ = 0x3fb8aa3b;
      auVar30._0_8_ = 0x3fb8aa3b3fb8aa3b;
      auVar30._12_4_ = 0x3fb8aa3b;
      auVar30._16_4_ = 0x3fb8aa3b;
      auVar30._20_4_ = 0x3fb8aa3b;
      auVar30._24_4_ = 0x3fb8aa3b;
      auVar30._28_4_ = 0x3fb8aa3b;
      auVar18 = vfmadd213ps_fma(auVar30,auVar6,auVar45._0_32_);
      auVar20 = vroundps_avx(ZEXT1632(auVar18),1);
      auVar22 = vcmpps_avx(ZEXT1632(auVar18),auVar20,1);
      auVar22 = vandps_avx(auVar47._0_32_,auVar22);
      auVar22 = vsubps_avx(auVar20,auVar22);
      auVar37._8_4_ = 0x3f318000;
      auVar37._0_8_ = 0x3f3180003f318000;
      auVar37._12_4_ = 0x3f318000;
      auVar37._16_4_ = 0x3f318000;
      auVar37._20_4_ = 0x3f318000;
      auVar37._24_4_ = 0x3f318000;
      auVar37._28_4_ = 0x3f318000;
      auVar18 = vfmsub231ps_fma(auVar6,auVar22,auVar37);
      auVar23 = vfmsub231ps_fma(ZEXT1632(auVar18),auVar22,auVar52._0_32_);
      auVar20 = ZEXT1632(auVar23);
      auVar6._28_4_ = 0x3f318000;
      auVar6._0_28_ =
           ZEXT1628(CONCAT412(auVar23._12_4_ * auVar23._12_4_,
                              CONCAT48(auVar23._8_4_ * auVar23._8_4_,
                                       CONCAT44(auVar23._4_4_ * auVar23._4_4_,
                                                auVar23._0_4_ * auVar23._0_4_))));
      auVar39._8_4_ = 0x39506967;
      auVar39._0_8_ = 0x3950696739506967;
      auVar39._12_4_ = 0x39506967;
      auVar39._16_4_ = 0x39506967;
      auVar39._20_4_ = 0x39506967;
      auVar39._24_4_ = 0x39506967;
      auVar39._28_4_ = 0x39506967;
      auVar18 = vfmadd213ps_fma(auVar39,auVar20,auVar53._0_32_);
      auVar42._8_4_ = 0x3c088908;
      auVar42._0_8_ = 0x3c0889083c088908;
      auVar42._12_4_ = 0x3c088908;
      auVar42._16_4_ = 0x3c088908;
      auVar42._20_4_ = 0x3c088908;
      auVar42._24_4_ = 0x3c088908;
      auVar42._28_4_ = 0x3c088908;
      auVar18 = vfmadd213ps_fma(ZEXT1632(auVar18),auVar20,auVar42);
      auVar43._8_4_ = 0x3d2aa9c1;
      auVar43._0_8_ = 0x3d2aa9c13d2aa9c1;
      auVar43._12_4_ = 0x3d2aa9c1;
      auVar43._16_4_ = 0x3d2aa9c1;
      auVar43._20_4_ = 0x3d2aa9c1;
      auVar43._24_4_ = 0x3d2aa9c1;
      auVar43._28_4_ = 0x3d2aa9c1;
      auVar18 = vfmadd213ps_fma(ZEXT1632(auVar18),auVar20,auVar43);
      auVar44._8_4_ = 0x3e2aaaaa;
      auVar44._0_8_ = 0x3e2aaaaa3e2aaaaa;
      auVar44._12_4_ = 0x3e2aaaaa;
      auVar44._16_4_ = 0x3e2aaaaa;
      auVar44._20_4_ = 0x3e2aaaaa;
      auVar44._24_4_ = 0x3e2aaaaa;
      auVar44._28_4_ = 0x3e2aaaaa;
      auVar20 = ZEXT1632(auVar23);
      auVar18 = vfmadd213ps_fma(ZEXT1632(auVar18),auVar20,auVar44);
      auVar18 = vfmadd213ps_fma(ZEXT1632(auVar18),auVar20,auVar45._0_32_);
      auVar17 = vfmadd213ps_fma(ZEXT1632(auVar18),auVar6,auVar20);
      auVar18._0_4_ = (int)auVar22._0_4_;
      auVar18._4_4_ = (int)auVar22._4_4_;
      auVar18._8_4_ = (int)auVar22._8_4_;
      auVar18._12_4_ = (int)auVar22._12_4_;
      auVar21._16_4_ = (int)auVar22._16_4_;
      auVar21._0_16_ = auVar18;
      auVar21._20_4_ = (int)auVar22._20_4_;
      auVar21._24_4_ = (int)auVar22._24_4_;
      auVar21._28_4_ = (int)auVar22._28_4_;
      auVar23 = vpslld_avx(auVar18,0x17);
      auVar18 = vpslld_avx(auVar21._16_16_,0x17);
      auVar32._8_4_ = 0x3f800000;
      auVar32._0_8_ = 0x3f8000003f800000;
      auVar32._12_4_ = 0x3f800000;
      auVar18 = vpaddd_avx(auVar18,auVar32);
      auVar23 = vpaddd_avx(auVar23,auVar32);
      auVar22._16_16_ = auVar18;
      auVar22._0_16_ = auVar23;
      auVar31._0_4_ = auVar47._0_4_ + auVar17._0_4_;
      auVar31._4_4_ = auVar47._4_4_ + auVar17._4_4_;
      auVar31._8_4_ = auVar47._8_4_ + auVar17._8_4_;
      auVar31._12_4_ = auVar47._12_4_ + auVar17._12_4_;
      auVar31._16_4_ = auVar47._16_4_ + 0.0;
      auVar31._20_4_ = auVar47._20_4_ + 0.0;
      auVar31._24_4_ = auVar47._24_4_ + 0.0;
      auVar31._28_4_ = auVar47._28_4_ + 0.0;
      auVar18 = vfmsub213ps_fma(auVar22,auVar31,auVar47._0_32_);
      auVar22 = vmaxps_avx(*pauVar9,auVar40._0_32_);
      auVar18 = vfmadd213ps_fma(ZEXT1632(auVar18),auVar15,auVar22);
      auVar20._4_4_ = auVar18._4_4_ * fVar1;
      auVar20._0_4_ = auVar18._0_4_ * fVar1;
      auVar20._8_4_ = auVar18._8_4_ * fVar1;
      auVar20._12_4_ = auVar18._12_4_ * fVar1;
      auVar20._16_4_ = fVar1 * 0.0;
      auVar20._20_4_ = fVar1 * 0.0;
      auVar20._24_4_ = fVar1 * 0.0;
      auVar20._28_4_ = auVar22._28_4_;
      *pauVar9 = auVar20;
      pauVar9 = pauVar9 + 1;
      lVar13 = lVar13 + 8;
    }
    fVar1 = (this->super_SELU).alpha;
    auVar23._4_4_ = fVar1;
    auVar23._0_4_ = fVar1;
    auVar23._8_4_ = fVar1;
    auVar23._12_4_ = fVar1;
    fVar1 = (this->super_SELU).lambda;
    for (; iVar11 + 3 < iVar10; iVar11 = iVar11 + 4) {
      auVar18 = vminps_avx(ZEXT816(0) << 0x40,*(undefined1 (*) [16])*pauVar9);
      auVar24._8_4_ = 0x42b0c0a5;
      auVar24._0_8_ = 0x42b0c0a542b0c0a5;
      auVar24._12_4_ = 0x42b0c0a5;
      auVar18 = vminps_avx(auVar18,auVar24);
      auVar25._8_4_ = 0xc2b0c0a5;
      auVar25._0_8_ = 0xc2b0c0a5c2b0c0a5;
      auVar25._12_4_ = 0xc2b0c0a5;
      auVar32 = vmaxps_avx(auVar18,auVar25);
      auVar26._8_4_ = 0x3fb8aa3b;
      auVar26._0_8_ = 0x3fb8aa3b3fb8aa3b;
      auVar26._12_4_ = 0x3fb8aa3b;
      auVar46._8_4_ = 0x3f000000;
      auVar46._0_8_ = 0x3f0000003f000000;
      auVar46._12_4_ = 0x3f000000;
      auVar18 = vfmadd213ps_fma(auVar26,auVar32,auVar46);
      auVar33._0_4_ = (int)auVar18._0_4_;
      auVar33._4_4_ = (int)auVar18._4_4_;
      auVar33._8_4_ = (int)auVar18._8_4_;
      auVar33._12_4_ = (int)auVar18._12_4_;
      auVar17 = vcvtdq2ps_avx(auVar33);
      auVar18 = vcmpps_avx(auVar18,auVar17,1);
      auVar41._8_4_ = 0x3f800000;
      auVar41._0_8_ = 0x3f8000003f800000;
      auVar41._12_4_ = 0x3f800000;
      auVar18 = vandps_avx(auVar41,auVar18);
      auVar18 = vsubps_avx(auVar17,auVar18);
      auVar34._8_4_ = 0x3f318000;
      auVar34._0_8_ = 0x3f3180003f318000;
      auVar34._12_4_ = 0x3f318000;
      auVar17 = vfmsub231ps_fma(auVar32,auVar18,auVar34);
      auVar35._8_4_ = 0x395e8083;
      auVar35._0_8_ = 0x395e8083395e8083;
      auVar35._12_4_ = 0x395e8083;
      auVar32 = vfmsub231ps_fma(auVar17,auVar18,auVar35);
      auVar36._0_4_ = auVar32._0_4_ * auVar32._0_4_;
      auVar36._4_4_ = auVar32._4_4_ * auVar32._4_4_;
      auVar36._8_4_ = auVar32._8_4_ * auVar32._8_4_;
      auVar36._12_4_ = auVar32._12_4_ * auVar32._12_4_;
      auVar38._8_4_ = 0x39506967;
      auVar38._0_8_ = 0x3950696739506967;
      auVar38._12_4_ = 0x39506967;
      auVar48._8_4_ = 0x3ab743ce;
      auVar48._0_8_ = 0x3ab743ce3ab743ce;
      auVar48._12_4_ = 0x3ab743ce;
      auVar17 = vfmadd213ps_fma(auVar38,auVar32,auVar48);
      auVar49._8_4_ = 0x3c088908;
      auVar49._0_8_ = 0x3c0889083c088908;
      auVar49._12_4_ = 0x3c088908;
      auVar17 = vfmadd213ps_fma(auVar17,auVar32,auVar49);
      auVar50._8_4_ = 0x3d2aa9c1;
      auVar50._0_8_ = 0x3d2aa9c13d2aa9c1;
      auVar50._12_4_ = 0x3d2aa9c1;
      auVar17 = vfmadd213ps_fma(auVar17,auVar32,auVar50);
      auVar51._8_4_ = 0x3e2aaaaa;
      auVar51._0_8_ = 0x3e2aaaaa3e2aaaaa;
      auVar51._12_4_ = 0x3e2aaaaa;
      auVar17 = vfmadd213ps_fma(auVar17,auVar32,auVar51);
      auVar17 = vfmadd213ps_fma(auVar17,auVar32,auVar46);
      auVar17 = vfmadd213ps_fma(auVar17,auVar36,auVar32);
      auVar19._0_4_ = auVar17._0_4_ + 1.0;
      auVar19._4_4_ = auVar17._4_4_ + 1.0;
      auVar19._8_4_ = auVar17._8_4_ + 1.0;
      auVar19._12_4_ = auVar17._12_4_ + 1.0;
      auVar27._0_4_ = (int)auVar18._0_4_;
      auVar27._4_4_ = (int)auVar18._4_4_;
      auVar27._8_4_ = (int)auVar18._8_4_;
      auVar27._12_4_ = (int)auVar18._12_4_;
      auVar18 = vpslld_avx(auVar27,0x17);
      auVar18 = vpaddd_avx(auVar41,auVar18);
      auVar17 = vfmsub213ps_fma(auVar18,auVar19,auVar41);
      auVar18 = vmaxps_avx(ZEXT816(0) << 0x40,*(undefined1 (*) [16])*pauVar9);
      auVar18 = vfmadd213ps_fma(auVar17,auVar23,auVar18);
      auVar17._0_4_ = auVar18._0_4_ * fVar1;
      auVar17._4_4_ = auVar18._4_4_ * fVar1;
      auVar17._8_4_ = auVar18._8_4_ * fVar1;
      auVar17._12_4_ = auVar18._12_4_ * fVar1;
      *(undefined1 (*) [16])*pauVar9 = auVar17;
      pauVar9 = (undefined1 (*) [32])(*pauVar9 + 0x10);
      lVar13 = lVar13 + 4;
    }
    fVar1 = (this->super_SELU).lambda;
    fVar2 = (this->super_SELU).alpha;
    lVar8 = sVar5 * sVar4 * uVar12;
    for (; (int)lVar13 < iVar10; lVar13 = lVar13 + 1) {
      fVar14 = *(float *)((long)pvVar3 + lVar13 * 4 + lVar8);
      if (0.0 <= fVar14) {
        fVar14 = fVar14 * (this->super_SELU).lambda;
      }
      else {
        auVar16._0_4_ = expf(fVar14);
        auVar16._4_60_ = extraout_var;
        auVar53 = ZEXT3264(CONCAT428(0x3ab743ce,
                                     CONCAT424(0x3ab743ce,
                                               CONCAT420(0x3ab743ce,
                                                         CONCAT416(0x3ab743ce,
                                                                   CONCAT412(0x3ab743ce,
                                                                             CONCAT48(0x3ab743ce,
                                                                                                                                                                            
                                                  0x3ab743ce3ab743ce)))))));
        auVar52 = ZEXT3264(CONCAT428(0x395e8083,
                                     CONCAT424(0x395e8083,
                                               CONCAT420(0x395e8083,
                                                         CONCAT416(0x395e8083,
                                                                   CONCAT412(0x395e8083,
                                                                             CONCAT48(0x395e8083,
                                                                                                                                                                            
                                                  0x395e8083395e8083)))))));
        auVar47 = ZEXT3264(CONCAT428(0x3f800000,
                                     CONCAT424(0x3f800000,
                                               CONCAT420(0x3f800000,
                                                         CONCAT416(0x3f800000,
                                                                   CONCAT412(0x3f800000,
                                                                             CONCAT48(0x3f800000,
                                                                                                                                                                            
                                                  0x3f8000003f800000)))))));
        auVar45 = ZEXT3264(CONCAT428(0x3f000000,
                                     CONCAT424(0x3f000000,
                                               CONCAT420(0x3f000000,
                                                         CONCAT416(0x3f000000,
                                                                   CONCAT412(0x3f000000,
                                                                             CONCAT48(0x3f000000,
                                                                                                                                                                            
                                                  0x3f0000003f000000)))))));
        auVar40 = ZEXT1664(ZEXT816(0) << 0x40);
        auVar18 = ZEXT416((uint)(fVar1 * fVar2));
        auVar18 = vfmsub213ss_fma(auVar16._0_16_,auVar18,auVar18);
        fVar14 = auVar18._0_4_;
      }
      *(float *)((long)pvVar3 + lVar13 * 4 + lVar8) = fVar14;
    }
  }
  return 0;
}

Assistant:

int SELU_x86_fma::forward_inplace(Mat& bottom_top_blob, const Option& opt) const
{
    int w = bottom_top_blob.w;
    int h = bottom_top_blob.h;
    int d = bottom_top_blob.d;
    int elempack = bottom_top_blob.elempack;
    int channels = bottom_top_blob.c;
    int size = w * h * d * elempack;

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int q = 0; q < channels; q++)
    {
        float* ptr = bottom_top_blob.channel(q);

        int i = 0;

#if __SSE2__
#if __AVX__
#if __AVX512F__
        __m512 _zero512 = _mm512_setzero_ps();
        __m512 _one512 = _mm512_set1_ps(1.f);
        __m512 _alpha512 = _mm512_set1_ps(alpha);
        __m512 _lambda512 = _mm512_set1_ps(lambda);
        for (; i + 15 < size; i += 16)
        {
            __m512 _p = _mm512_loadu_ps(ptr);

            __m512 _pos = _mm512_max_ps(_zero512, _p);
            __m512 _neg = _mm512_min_ps(_zero512, _p);

            __m512 _blob = exp512_ps(_neg);
            _blob = _mm512_sub_ps(_blob, _one512);
            _blob = _mm512_mul_ps(_alpha512, _blob);
            _blob = _mm512_mul_ps(_lambda512, _mm512_add_ps(_pos, _blob));

            _mm512_storeu_ps(ptr, _blob);

            ptr += 16;
        }
#endif // __AVX512F__
        __m256 _zero256 = _mm256_setzero_ps();
        __m256 _one256 = _mm256_set1_ps(1.f);
        __m256 _alpha256 = _mm256_set1_ps(alpha);
        __m256 _lambda256 = _mm256_set1_ps(lambda);
        for (; i + 7 < size; i += 8)
        {
            __m256 _p = _mm256_loadu_ps(ptr);

            __m256 _pos = _mm256_max_ps(_zero256, _p);
            __m256 _neg = _mm256_min_ps(_zero256, _p);

            __m256 _blob = exp256_ps(_neg);
            _blob = _mm256_sub_ps(_blob, _one256);
            _blob = _mm256_mul_ps(_alpha256, _blob);
            _blob = _mm256_mul_ps(_lambda256, _mm256_add_ps(_pos, _blob));

            _mm256_storeu_ps(ptr, _blob);

            ptr += 8;
        }
#endif // __AVX__
        __m128 _zero128 = _mm_setzero_ps();
        __m128 _one128 = _mm_set1_ps(1.f);
        __m128 _alpha128 = _mm_set1_ps(alpha);
        __m128 _lambda128 = _mm_set1_ps(lambda);
        for (; i + 3 < size; i += 4)
        {
            __m128 _p = _mm_loadu_ps(ptr);

            __m128 _pos = _mm_max_ps(_zero128, _p);
            __m128 _neg = _mm_min_ps(_zero128, _p);

            __m128 _blob = exp_ps(_neg);
            _blob = _mm_sub_ps(_blob, _one128);
            _blob = _mm_mul_ps(_alpha128, _blob);
            _blob = _mm_mul_ps(_lambda128, _mm_add_ps(_pos, _blob));

            _mm_storeu_ps(ptr, _blob);

            ptr += 4;
        }
#endif // __SSE2__
        float alphaxlambda = alpha * lambda;
        for (; i < size; i++)
        {
            // y = lambda * ( max(0, x) + min(0, alpha * (exp(x) - 1)) )
            if (*ptr < 0)
                *ptr = (expf(*ptr) - 1.f) * alphaxlambda;
            else
                *ptr = *ptr * lambda;
            ptr++;
        }
    }

    return 0;
}